

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O0

int ddGroupSiftingUp(DdManager *table,int y,int xLow,DD_CHKFP checkFunction,Move **moves)

{
  int y_00;
  DdHalfWord x_00;
  Move *pMVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  int local_68;
  int L;
  int isolated;
  int z;
  int zindex;
  int yindex;
  int xindex;
  int limitSize;
  int gybot;
  int gxtop;
  int i;
  int size;
  int x;
  Move *move;
  Move **moves_local;
  DD_CHKFP checkFunction_local;
  int xLow_local;
  int y_local;
  DdManager *table_local;
  
  y_00 = table->invperm[y];
  yindex = table->keys - table->isolated;
  for (xindex = y; (uint)xindex < table->subtables[xindex].next;
      xindex = table->subtables[xindex].next) {
  }
  local_68 = yindex;
  for (L = xLow + 1; L <= xindex; L = L + 1) {
    iVar3 = table->invperm[L];
    if ((iVar3 == y_00) || (iVar2 = cuddTestInteract(table,iVar3,y_00), iVar2 != 0)) {
      local_68 = local_68 - (table->subtables[L].keys - (uint)(table->vars[iVar3]->ref == 1));
    }
  }
  i = cuddNextLow(table,y);
  checkFunction_local._4_4_ = y;
  do {
    if (i < xLow || yindex < local_68) {
      return 1;
    }
    x_00 = table->subtables[i].next;
    iVar3 = (*checkFunction)(table,i,checkFunction_local._4_4_);
    if (iVar3 == 0) {
      if ((table->subtables[i].next == i) &&
         (table->subtables[(int)checkFunction_local._4_4_].next == checkFunction_local._4_4_)) {
        iVar3 = table->invperm[i];
        iVar2 = cuddSwapInPlace(table,i,checkFunction_local._4_4_);
        if (iVar2 == 0) goto LAB_00c1883e;
        iVar4 = cuddTestInteract(table,iVar3,y_00);
        if (iVar4 != 0) {
          local_68 = (table->subtables[(int)checkFunction_local._4_4_].keys -
                     (uint)(table->vars[iVar3]->ref == 1)) + local_68;
        }
        pDVar5 = cuddDynamicAllocNode(table);
        if (pDVar5 == (DdNode *)0x0) goto LAB_00c1883e;
        pDVar5->index = i;
        pDVar5->ref = checkFunction_local._4_4_;
        *(undefined4 *)&pDVar5->next = 0;
        *(int *)((long)&pDVar5->next + 4) = iVar2;
        (pDVar5->type).kids.T = (DdNode *)*moves;
        *moves = (Move *)pDVar5;
        if ((double)yindex * table->maxGrowth < (double)iVar2) {
          return 1;
        }
        if (iVar2 < yindex) {
          yindex = iVar2;
        }
      }
      else {
        iVar3 = ddGroupMove(table,i,checkFunction_local._4_4_,moves);
        if (iVar3 == 0) {
LAB_00c1883e:
          while (*moves != (Move *)0x0) {
            pMVar1 = (*moves)->next;
            (*moves)->y = 0;
            *(DdNode **)&(*moves)->flags = table->nextFree;
            table->nextFree = (DdNode *)*moves;
            *moves = pMVar1;
          }
          return 0;
        }
        L = (*moves)->y;
        do {
          iVar2 = table->invperm[L];
          iVar4 = cuddTestInteract(table,iVar2,y_00);
          if (iVar4 != 0) {
            local_68 = (table->subtables[L].keys - (uint)(table->vars[iVar2]->ref == 1)) + local_68;
          }
          L = table->subtables[L].next;
        } while (L != (*moves)->y);
        if ((double)yindex * table->maxGrowth < (double)iVar3) {
          return 1;
        }
        if (iVar3 < yindex) {
          yindex = iVar3;
        }
      }
    }
    else {
      table->subtables[i].next = checkFunction_local._4_4_;
      gybot = table->subtables[(int)checkFunction_local._4_4_].next;
      while (table->subtables[gybot].next != checkFunction_local._4_4_) {
        gybot = table->subtables[gybot].next;
      }
      table->subtables[gybot].next = x_00;
      pDVar5 = cuddDynamicAllocNode(table);
      if (pDVar5 == (DdNode *)0x0) goto LAB_00c1883e;
      pDVar5->index = i;
      pDVar5->ref = checkFunction_local._4_4_;
      *(undefined4 *)&pDVar5->next = 8;
      *(uint *)((long)&pDVar5->next + 4) = table->keys - table->isolated;
      (pDVar5->type).kids.T = (DdNode *)*moves;
      *moves = (Move *)pDVar5;
    }
    i = cuddNextLow(table,x_00);
    checkFunction_local._4_4_ = x_00;
  } while( true );
}

Assistant:

static int
ddGroupSiftingUp(
  DdManager * table,
  int  y,
  int  xLow,
  DD_CHKFP checkFunction,
  Move ** moves)
{
    Move *move;
    int  x;
    int  size;
    int  i;
    int  gxtop,gybot;
    int  limitSize;
    int  xindex, yindex;
    int  zindex;
    int  z;
    int  isolated;
    int  L;     /* lower bound on DD size */
#ifdef DD_DEBUG
    int  checkL;
#endif

    yindex = table->invperm[y];

    /* Initialize the lower bound.
    ** The part of the DD below the bottom of y's group will not change.
    ** The part of the DD above y that does not interact with any
    ** variable of y's group will not change.
    ** The rest may vanish in the best case, except for
    ** the nodes at level xLow, which will not vanish, regardless.
    ** What we use here is not really a lower bound, because we ignore
    ** the interactions with all variables except y.
    */
    limitSize = L = table->keys - table->isolated;
    gybot = y;
    while ((unsigned) gybot < table->subtables[gybot].next)
        gybot = table->subtables[gybot].next;
    for (z = xLow + 1; z <= gybot; z++) {
        zindex = table->invperm[z];
        if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
            isolated = table->vars[zindex]->ref == 1;
            L -= table->subtables[z].keys - isolated;
        }
    }

    x = cuddNextLow(table,y);
    while (x >= xLow && L <= limitSize) {
#ifdef DD_DEBUG
        gybot = y;
        while ((unsigned) gybot < table->subtables[gybot].next)
            gybot = table->subtables[gybot].next;
        checkL = table->keys - table->isolated;
        for (z = xLow + 1; z <= gybot; z++) {
            zindex = table->invperm[z];
            if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkL -= table->subtables[z].keys - isolated;
            }
        }
        if (pr > 0 && L != checkL) {
            (void) fprintf(table->out,
                           "Inaccurate lower bound: L = %d checkL = %d\n",
                           L, checkL);
        }
#endif
        gxtop = table->subtables[x].next;
        if (checkFunction(table,x,y)) {
            /* Group found, attach groups */
            table->subtables[x].next = y;
            i = table->subtables[y].next;
            while (table->subtables[i].next != (unsigned) y)
                i = table->subtables[i].next;
            table->subtables[i].next = gxtop;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL) goto ddGroupSiftingUpOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_NEWNODE;
            move->size = table->keys - table->isolated;
            move->next = *moves;
            *moves = move;
        } else if (table->subtables[x].next == (unsigned) x &&
                   table->subtables[y].next == (unsigned) y) {
            /* x and y are self groups */
            xindex = table->invperm[x];
            size = cuddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtables[x].next == (unsigned) x);
            assert(table->subtables[y].next == (unsigned) y);
#endif
            if (size == 0) goto ddGroupSiftingUpOutOfMem;
            /* Update the lower bound. */
            if (cuddTestInteract(table,xindex,yindex)) {
                isolated = table->vars[xindex]->ref == 1;
                L += table->subtables[y].keys - isolated;
            }
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL) goto ddGroupSiftingUpOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_DEFAULT;
            move->size = size;
            move->next = *moves;
            *moves = move;

#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,
                                       "ddGroupSiftingUp (2 single groups):\n");
#endif
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        } else { /* Group move */
            size = ddGroupMove(table,x,y,moves);
            if (size == 0) goto ddGroupSiftingUpOutOfMem;
            /* Update the lower bound. */
            z = (*moves)->y;
            do {
                zindex = table->invperm[z];
                if (cuddTestInteract(table,zindex,yindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    L += table->subtables[z].keys - isolated;
                }
                z = table->subtables[z].next;
            } while (z != (int) (*moves)->y);
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        }
        y = gxtop;
        x = cuddNextLow(table,y);
    }

    return(1);

ddGroupSiftingUpOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}